

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

chunk_conflict * town_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  ushort uVar1;
  loc_conflict to_avoid;
  loc_conflict grid_00;
  loc grid_01;
  bool bVar2;
  _Bool _Var3;
  chunk_conflict *source;
  chunk *c;
  feature *pfVar4;
  uint local_48;
  _Bool found;
  chunk_conflict *c_old;
  chunk_conflict *c_new;
  wchar_t residents;
  loc grid;
  wchar_t i;
  char **p_error_local;
  wchar_t min_width_local;
  wchar_t min_height_local;
  player *p_local;
  
  _Var3 = is_daytime();
  if (_Var3) {
    uVar1 = z_info->town_monsters_day;
  }
  else {
    uVar1 = z_info->town_monsters_night;
  }
  local_48 = (uint)uVar1;
  source = chunk_find_name("Town");
  c = (chunk *)cave_new((uint)z_info->town_hgt,(uint)z_info->town_wid);
  if (source == (chunk_conflict *)0x0) {
    c->depth = (int)p->depth;
    town_gen_layout((chunk_conflict *)c,p);
  }
  else {
    c->depth = source->depth;
    _Var3 = chunk_copy((chunk_conflict *)c,p,source,L'\0',L'\0',L'\0',false);
    if (!_Var3) {
      quit_fmt("chunk_copy() level bounds failed!");
    }
    chunk_list_remove("Town");
    cave_free(source);
    for (residents = L'\0'; residents < c->height; residents = residents + L'\x01') {
      bVar2 = false;
      for (c_new._4_4_ = L'\0'; c_new._4_4_ < c->width; c_new._4_4_ = c_new._4_4_ + L'\x01') {
        grid_00.y = residents;
        grid_00.x = c_new._4_4_;
        pfVar4 = square_feat(c,grid_00);
        if (pfVar4->fidx == L'\x06') {
          bVar2 = true;
          break;
        }
      }
      if (bVar2) break;
    }
    grid_01.y = residents;
    grid_01.x = c_new._4_4_;
    player_place((chunk_conflict1 *)c,p,grid_01);
  }
  _Var3 = is_daytime();
  cave_illuminate(c,_Var3);
  for (grid.x = 0; grid.x < (int)local_48; grid.x = grid.x + 1) {
    to_avoid.x = (p->grid).x;
    to_avoid.y = (p->grid).y;
    pick_and_place_distant_monster(c,to_avoid,L'\x03',true,c->depth);
  }
  return (chunk_conflict *)c;
}

Assistant:

struct chunk *town_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i;
	struct loc grid;
	int residents = is_daytime() ? z_info->town_monsters_day :
		z_info->town_monsters_night;
	struct chunk *c_new, *c_old = chunk_find_name("Town");

	/* Make a new chunk */
	c_new = cave_new(z_info->town_hgt, z_info->town_wid);

	/* First time */
	if (!c_old) {
		c_new->depth = p->depth;

		/* Build stuff */
		town_gen_layout(c_new, p);
	} else {
		/* Copy from the chunk list, remove the old one */
		c_new->depth = c_old->depth;
		if (!chunk_copy(c_new, p, c_old, 0, 0, 0, 0))
			quit_fmt("chunk_copy() level bounds failed!");
		chunk_list_remove("Town");
		cave_free(c_old);

		/* Find the stairs (lame) */
		for (grid.y = 0; grid.y < c_new->height; grid.y++) {
			bool found = false;
			for (grid.x = 0; grid.x < c_new->width; grid.x++) {
				if (square_feat(c_new, grid)->fidx == FEAT_MORE) {
					found = true;
					break;
				}
			}
			if (found) break;
		}

		/* Place the player */
		player_place(c_new, p, grid);
	}

	/* Apply illumination */
	cave_illuminate(c_new, is_daytime());

	/* Make some residents */
	for (i = 0; i < residents; i++) {
		pick_and_place_distant_monster(c_new, p->grid, 3, true,
			c_new->depth);
	}

	return c_new;
}